

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::AdvancedSyncImageAccess2::Cleanup(AdvancedSyncImageAccess2 *this)

{
  int width;
  int height;
  AdvancedSyncImageAccess2 *this_local;
  
  width = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
  height = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase);
  glu::CallLogWrapper::glViewport
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0,width,height);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_vbo);
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_texture);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_store_program);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_draw_program);
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_vao);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_buffer);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		glUseProgram(0);
		glDeleteBuffers(1, &m_vbo);
		glDeleteTextures(1, &m_texture);
		glDeleteProgram(m_store_program);
		glDeleteProgram(m_draw_program);
		glDeleteVertexArrays(1, &m_vao);
		glDeleteBuffers(1, &m_buffer);
		return NO_ERROR;
	}